

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

int __thiscall CCEXP::CCEXPMat<int>::AppendRow(CCEXPMat<int> *this,size_t row,int *ptr,size_t n)

{
  MVECTOR<int> *this_00;
  char *pcVar1;
  size_t sVar2;
  int *piVar3;
  char *local_60;
  char *local_58;
  int *Dptr;
  size_t currentData;
  MVECTOR<int> *it;
  size_t n_local;
  int *ptr_local;
  size_t row_local;
  CCEXPMat<int> *this_local;
  
  if ((this->IgnoreM & 1U) == 0) {
    this_00 = getDataRowPtr(this,row);
    if (this_00 == (MVECTOR<int> *)0x0) {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x2f);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x5c);
        if (pcVar1 == (char *)0x0) {
          local_60 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
          ;
        }
        else {
          local_60 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x5c);
          local_60 = local_60 + 1;
        }
        local_58 = local_60;
      }
      else {
        local_58 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x2f);
        local_58 = local_58 + 1;
      }
      CECS::RecError((CECS *)CCEXPECS,-9999,1,local_58,0x11b,
                     "CCEXPMat::AppendRow():: \'it\' is nullptr");
      this_local._4_4_ = -9999;
    }
    else {
      sVar2 = ns_MVECTOR::MVECTOR<int>::size(this_00);
      ns_MVECTOR::MVECTOR<int>::resize(this_00,sVar2 + n);
      piVar3 = ns_MVECTOR::MVECTOR<int>::data(this_00);
      memcpy(piVar3 + sVar2,ptr,n << 2);
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CCEXPMat<T>::AppendRow(size_t row, T* ptr, size_t n) {
	if (IgnoreM) return 0;
	MVECTOR<T>* it = getDataRowPtr(row); CECS_ERRI(CCEXPECS, it == nullptr, "CCEXPMat::AppendRow():: 'it' is nullptr");
	const size_t currentData = (*it).size();
	(*it).resize(currentData + n);
	T* Dptr = (*it).data();
	memcpy(&Dptr[currentData], ptr, sizeof(T) * n);
	return 0;
}